

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float32 cal_constD(vector_t in_mean,vector_t wt_num_mean,vector_t wt_den_mean,vector_t in_var,
                  vector_t wt_num_var,vector_t wt_den_var,float32 num_dnom,float32 den_dnom,
                  uint32 n_veclen,float32 constE)

{
  uint32 uVar1;
  float local_90;
  float local_8c;
  double local_88;
  float local_7c;
  double dStack_78;
  float32 d_mmi;
  float64 root2;
  float64 root1;
  float64 z;
  float64 y;
  float64 x;
  uint local_48;
  float32 d;
  uint32 l;
  float32 constE_local;
  float32 den_dnom_local;
  float32 num_dnom_local;
  vector_t wt_den_var_local;
  vector_t wt_num_var_local;
  vector_t in_var_local;
  vector_t wt_den_mean_local;
  vector_t wt_num_mean_local;
  vector_t in_mean_local;
  
  x._4_4_ = 0.0;
  local_7c = 0.0;
  d = constE;
  l = (uint32)den_dnom;
  constE_local = num_dnom;
  _den_dnom_local = wt_den_var;
  wt_den_var_local = wt_num_var;
  wt_num_var_local = in_var;
  in_var_local = wt_den_mean;
  wt_den_mean_local = wt_num_mean;
  wt_num_mean_local = in_mean;
  for (local_48 = 0; local_48 < n_veclen; local_48 = local_48 + 1) {
    y = (float64)(double)wt_num_var_local[local_48];
    z = (float64)(double)(-(wt_num_mean_local[local_48] * 2.0) *
                          (wt_den_mean_local[local_48] - in_var_local[local_48]) +
                         (wt_num_mean_local[local_48] * wt_num_mean_local[local_48] +
                         wt_num_var_local[local_48]) * ((float)constE_local - (float)l) +
                         (wt_den_var_local[local_48] - _den_dnom_local[local_48]));
    root1 = (float64)(double)((wt_den_var_local[local_48] - _den_dnom_local[local_48]) *
                              ((float)constE_local - (float)l) +
                             -((wt_den_mean_local[local_48] - in_var_local[local_48]) *
                              (wt_den_mean_local[local_48] - in_var_local[local_48])));
    uVar1 = solve_quadratic(y,z,root1,&root2,(float64 *)&stack0xffffffffffffff88);
    if (uVar1 != 0) {
      if ((double)root2 <= dStack_78) {
        local_88 = dStack_78;
      }
      else {
        local_88 = (double)root2;
      }
      x._4_4_ = (float)(local_88 * 2.0);
    }
    if (x._4_4_ <= (float)d * (float)l) {
      local_8c = (float)d * (float)l;
    }
    else {
      local_8c = x._4_4_;
    }
    x._4_4_ = local_8c;
    if (local_7c <= local_8c) {
      local_90 = local_8c;
    }
    else {
      local_90 = local_7c;
    }
    local_7c = local_90;
  }
  return (float32)local_7c;
}

Assistant:

float32
cal_constD(vector_t in_mean,
	   vector_t wt_num_mean,
	   vector_t wt_den_mean,
	   vector_t in_var,
	   vector_t wt_num_var,
	   vector_t wt_den_var,
	   float32 num_dnom,
	   float32 den_dnom,
	   uint32 n_veclen,
	   float32 constE)
{
    uint32 l;
    float32 d = 0.0;
    float64 x, y, z;
    float64 root1, root2;
    float32 d_mmi = 0.0;
    
    for (l = 0; l < n_veclen; l++) {
	x = in_var[l];
	y = (in_var[l] + in_mean[l]*in_mean[l]) * (num_dnom - den_dnom) + (wt_num_var[l] - wt_den_var[l])
	    - 2*in_mean[l]*(wt_num_mean[l] - wt_den_mean[l]);
	z = (wt_num_var[l] - wt_den_var[l]) * (num_dnom - den_dnom) - (wt_num_mean[l] - wt_den_mean[l]) * (wt_num_mean[l] - wt_den_mean[l]);
	
	if (solve_quadratic(x, y, z, &root1, &root2))
	    d = MAX(root1, root2) * D_FACTOR;
	
	d = MAX(d, constE*den_dnom);
	
	d_mmi = MAX(d_mmi, d);
    }
    
    return d_mmi;
}